

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O0

void __thiscall QAction::setWhatsThis(QAction *this,QString *whatsthis)

{
  bool bVar1;
  QActionPrivate *rhs;
  QString *in_RSI;
  QActionPrivate *in_RDI;
  QActionPrivate *d;
  
  rhs = d_func((QAction *)0x97667c);
  bVar1 = ::operator==(in_RSI,(QString *)rhs);
  if (!bVar1) {
    QString::operator=(&rhs->whatsthis,(QString *)in_RSI);
    QActionPrivate::sendDataChanged(in_RDI);
  }
  return;
}

Assistant:

void QAction::setWhatsThis(const QString &whatsthis)
{
    Q_D(QAction);
    if (d->whatsthis == whatsthis)
        return;

    d->whatsthis = whatsthis;
    d->sendDataChanged();
}